

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

vector<restaurant_*,_std::allocator<restaurant_*>_> * __thiscall
graph::getAdjacent(vector<restaurant_*,_std::allocator<restaurant_*>_> *__return_storage_ptr__,
                  graph *this,restaurant *vertex)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  iterator iVar3;
  mapped_type *__x;
  mapped_type *__x_00;
  int i;
  ulong uVar4;
  int key;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> list;
  int local_54;
  restaurant *local_50;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = vertex;
  pmVar2 = std::__detail::
           _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->mapper,&local_50);
  iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->v)._M_t,pmVar2);
  p_Var1 = &(this->v)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    pmVar2 = std::__detail::
             _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->mapper,&local_50);
    __x = std::__detail::
          _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this,pmVar2);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48,__x);
    uVar4 = 0;
    while( true ) {
      if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
      local_54 = local_48._M_impl.super__Vector_impl_data._M_start[uVar4].first;
      iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&(this->v)._M_t,&local_54);
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
        __x_00 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_restaurant_*>,_std::allocator<std::pair<const_int,_restaurant_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_restaurant_*>,_std::allocator<std::pair<const_int,_restaurant_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->reverseMapper,&local_54);
        std::vector<restaurant_*,_std::allocator<restaurant_*>_>::push_back
                  (__return_storage_ptr__,__x_00);
      }
      uVar4 = uVar4 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<restaurant**,std::vector<restaurant*,std::allocator<restaurant*>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((__return_storage_ptr__->
               super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<restaurant_*,_std::allocator<restaurant_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<restaurant *> graph::getAdjacent(restaurant *vertex)
{
    vector<restaurant *> adj;
    if (v.find(mapper[vertex]) == v.end())
    {
        return adj;
    }
    vector<pair<int, int>> list = theGraph[mapper[vertex]];

    for (int i = 0; i < list.size(); i++)
    {
        // find vertex to add
        int key = list[i].first;
        if (v.find(key) != v.end())
        {
            adj.push_back(reverseMapper[key]);
        }
    }

    sort(adj.begin(), adj.end());
    return adj;
}